

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validators.hpp
# Opt level: O0

type_conflict3 CLI::detail::checked_multiply<unsigned_long>(unsigned_long *a,unsigned_long b)

{
  unsigned_long uVar1;
  unsigned_long uVar2;
  unsigned_long uVar3;
  type_conflict2 tVar4;
  unsigned_long local_20;
  unsigned_long b_local;
  unsigned_long *a_local;
  
  if ((((*a == 0) || (b == 0)) || (*a == 1)) || (b == 1)) {
    *a = b * *a;
    a_local._7_1_ = true;
  }
  else {
    uVar3 = *a;
    local_20 = b;
    b_local = (unsigned_long)a;
    uVar2 = _GLOBAL__N_1::std::numeric_limits<unsigned_long>::min();
    uVar1 = local_20;
    if ((uVar3 != uVar2) &&
       (uVar3 = _GLOBAL__N_1::std::numeric_limits<unsigned_long>::min(), uVar1 != uVar3)) {
      tVar4 = overflowCheck<unsigned_long>((unsigned_long *)b_local,&local_20);
      if (tVar4 != 0) {
        return false;
      }
      *(unsigned_long *)b_local = local_20 * *(long *)b_local;
      return true;
    }
    a_local._7_1_ = false;
  }
  return a_local._7_1_;
}

Assistant:

typename std::enable_if<std::is_integral<T>::value, bool>::type checked_multiply(T &a, T b) {
    if(a == 0 || b == 0 || a == 1 || b == 1) {
        a *= b;
        return true;
    }
    if(a == (std::numeric_limits<T>::min)() || b == (std::numeric_limits<T>::min)()) {
        return false;
    }
    if(overflowCheck(a, b)) {
        return false;
    }
    a *= b;
    return true;
}